

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O2

int CRYPTO_BUFFER_cmp(CRYPTO_BUFFER *a,CRYPTO_BUFFER *b)

{
  size_t __n;
  uint __line;
  int iVar1;
  char *__assertion;
  
  if (a->pool == (CRYPTO_BUFFER_POOL *)0x0) {
    __assertion = "a->pool != NULL";
    __line = 0x24;
  }
  else {
    if (a->pool == b->pool) {
      __n = a->len;
      if (__n == b->len) {
        if (__n != 0) {
          iVar1 = memcmp(a->data,b->data,__n);
          return iVar1;
        }
        iVar1 = 0;
      }
      else {
        iVar1 = 1;
      }
      return iVar1;
    }
    __assertion = "a->pool == b->pool";
    __line = 0x25;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool.cc"
                ,__line,"int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *, const CRYPTO_BUFFER *)");
}

Assistant:

static int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *a, const CRYPTO_BUFFER *b) {
  // Only |CRYPTO_BUFFER|s from the same pool have compatible hashes.
  assert(a->pool != NULL);
  assert(a->pool == b->pool);
  if (a->len != b->len) {
    return 1;
  }
  return OPENSSL_memcmp(a->data, b->data, a->len);
}